

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O1

void __thiscall
Assimp::IFC::Schema_2x3::IfcRectangleProfileDef::~IfcRectangleProfileDef
          (IfcRectangleProfileDef *this)

{
  undefined1 *puVar1;
  undefined1 *puVar2;
  
  this[-1].super_IfcParameterizedProfileDef.super_IfcProfileDef.ProfileName.ptr._M_string_length =
       0x82af28;
  *(undefined8 *)
   &(this->super_IfcParameterizedProfileDef).super_IfcProfileDef.
    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcProfileDef,_2UL>.field_0x20 = 0x82af50;
  puVar2 = *(undefined1 **)&this[-1].super_IfcParameterizedProfileDef.super_IfcProfileDef.field_0x68
  ;
  puVar1 = &this[-1].super_IfcParameterizedProfileDef.field_0x78;
  if (puVar2 != puVar1) {
    operator_delete(puVar2,*(long *)puVar1 + 1);
  }
  puVar1 = *(undefined1 **)
            ((long)&this[-1].super_IfcParameterizedProfileDef.super_IfcProfileDef.ProfileName.ptr.
                    field_2 + 8);
  puVar2 = &this[-1].super_IfcParameterizedProfileDef.super_IfcProfileDef.field_0x58;
  if (puVar1 != puVar2) {
    operator_delete(puVar1,*(long *)puVar2 + 1);
  }
  operator_delete(&this[-1].super_IfcParameterizedProfileDef.super_IfcProfileDef.ProfileName.ptr.
                   _M_string_length,0xa8);
  return;
}

Assistant:

IfcRectangleProfileDef() : Object("IfcRectangleProfileDef") {}